

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_3d.cpp
# Opt level: O3

size_t prediction_and_quantization_3d_with_border_prediction<float>
                 (float *data,DSize_3d *size,meanInfo<float> *mean_info,double precision,
                 int capacity,int intv_radius,uchar *indicator,int *type,int *reg_params_type,
                 float **reg_unpredictable_data_pos,float **unpredictable_data_pos)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int i;
  int iVar9;
  int iVar10;
  undefined8 *__ptr;
  long lVar11;
  void *__dest;
  long lVar12;
  ulong uVar13;
  int size_z;
  int size_y;
  ulong uVar14;
  int size_x;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  float *pfVar19;
  long lVar20;
  int iVar21;
  float *pfVar22;
  void *pvVar23;
  float *pfVar24;
  float *pfVar25;
  long lVar26;
  float *data_pos;
  long lVar27;
  int iVar28;
  long lVar29;
  int *piVar30;
  float *reg_params_pos;
  float *pfVar31;
  float fVar32;
  float fVar33;
  double dVar34;
  float fVar35;
  double dVar36;
  double reg_precisions [4];
  size_t local_178;
  uchar *local_168;
  int *local_160;
  size_t local_158;
  ulong local_150;
  size_t local_100;
  double local_58 [5];
  
  __ptr = (undefined8 *)malloc(size->num_blocks * 0x10 + 0x10);
  *__ptr = 0;
  __ptr[1] = 0;
  fVar32 = (float)(precision * 0.1 * 0.25);
  uVar16 = (ulong)size->block_size;
  local_58[3] = (double)fVar32;
  local_58[0] = (double)(fVar32 / (float)size->block_size);
  sVar6 = size->d3;
  lVar11 = size->d2 + 1;
  lVar1 = sVar6 + 1;
  lVar29 = lVar1 * lVar11;
  local_58[1] = local_58[0];
  local_58[2] = local_58[0];
  __dest = calloc(1,(uVar16 + 1) * lVar29 * 4);
  uVar13 = size->num_x;
  if (uVar13 == 0) {
    local_100 = 0;
  }
  else {
    reg_params_pos = (float *)(__ptr + 2);
    iVar9 = capacity + -2;
    if (mean_info->use_mean == false) {
      iVar9 = capacity;
    }
    local_178 = size->num_y;
    lVar4 = sVar6 * 4 + 4;
    local_100 = 0;
    uVar17 = 0;
    local_168 = indicator;
    local_158 = local_178;
    do {
      uVar2 = uVar17 + 1;
      if (local_178 == 0) {
        local_178 = 0;
        local_160 = reg_params_type;
      }
      else {
        uVar13 = size->num_z;
        local_150 = 0;
        pfVar19 = data;
        pvVar23 = __dest;
        do {
          if (uVar13 == 0) {
            lVar26 = (long)(int)uVar16;
            uVar13 = 0;
          }
          else {
            uVar14 = 0;
            data_pos = pfVar19;
            do {
              iVar10 = (int)uVar16;
              lVar26 = (long)iVar10;
              size_x = (int)size->d1 - (int)uVar17 * iVar10;
              if (uVar2 * lVar26 < size->d1) {
                size_x = iVar10;
              }
              size_y = (int)size->d2 - (int)local_150 * iVar10;
              if ((local_150 + 1) * lVar26 < size->d2) {
                size_y = iVar10;
              }
              uVar3 = uVar14 + 1;
              size_z = (int)size->d3 - (int)uVar14 * iVar10;
              if (lVar26 * uVar3 < size->d3) {
                size_z = iVar10;
              }
              iVar10 = size_y;
              if (size_x < size_y) {
                iVar10 = size_x;
              }
              if (size_z <= iVar10) {
                iVar10 = size_z;
              }
              if (iVar10 < 4) {
                *local_168 = '\0';
LAB_00104d94:
                if (0 < size_x) {
                  sVar7 = size->dim0_offset;
                  sVar8 = size->dim1_offset;
                  lVar26 = (long)pvVar23 + lVar1 * 4 + lVar29 * 4 + 4;
                  iVar10 = 0;
                  pfVar25 = data_pos;
                  do {
                    if (0 < size_y) {
                      bVar5 = mean_info->use_mean;
                      lVar27 = lVar26 + (sVar6 * 4 + lVar29 * 4 ^ 0xfffffffffffffffc);
                      lVar12 = lVar29 * -4 + lVar26;
                      lVar20 = lVar26 + (sVar6 * 4 ^ 0xfffffffffffffffc);
                      iVar21 = 0;
                      pfVar22 = *unpredictable_data_pos;
                      do {
                        pfVar24 = pfVar22;
                        if (0 < size_z) {
                          lVar18 = 0;
                          iVar28 = size_z;
                          do {
                            fVar32 = *(float *)((long)pfVar25 + lVar18);
                            if (((bVar5 & 1U) == 0) ||
                               (fVar33 = mean_info->mean, precision <= (double)ABS(fVar32 - fVar33))
                               ) {
                              fVar33 = ((((*(float *)(lVar26 + -4 + lVar18) +
                                           *(float *)(lVar20 + lVar18) + *(float *)(lVar12 + lVar18)
                                          ) - *(float *)(lVar20 + -4 + lVar18)) -
                                        *(float *)(lVar12 + -4 + lVar18)) -
                                       *(float *)(lVar27 + lVar18)) +
                                       *(float *)(lVar27 + -4 + lVar18);
                              fVar35 = fVar32 - fVar33;
                              dVar34 = (double)ABS(fVar35) / precision + 1.0;
                              if ((double)iVar9 <= dVar34) {
LAB_00104f37:
                                *(float *)(lVar26 + lVar18) = fVar32;
                                pfVar24 = pfVar22 + 1;
                                *unpredictable_data_pos = pfVar24;
                                *pfVar22 = fVar32;
                                iVar15 = 0;
                                pfVar22 = pfVar24;
                              }
                              else {
                                if (fVar35 <= 0.0) {
                                  dVar34 = -dVar34;
                                }
                                fVar33 = (float)((double)((int)(dVar34 * 0.5) * 2) * precision +
                                                (double)fVar33);
                                *(float *)(lVar26 + lVar18) = fVar33;
                                if (precision < (double)ABS(fVar33 - fVar32)) goto LAB_00104f37;
                                iVar15 = (int)(dVar34 * 0.5) + intv_radius;
                              }
                              *(int *)((long)type + lVar18) = iVar15;
                            }
                            else {
                              *(undefined4 *)((long)type + lVar18) = 1;
                              *(float *)(lVar26 + lVar18) = fVar33;
                            }
                            lVar18 = lVar18 + 4;
                            iVar28 = iVar28 + -1;
                          } while (iVar28 != 0);
                          type = (int *)((long)type + lVar18);
                          pfVar25 = (float *)((long)pfVar25 + lVar18);
                        }
                        lVar26 = lVar26 + lVar4;
                        pfVar25 = pfVar25 + (sVar8 - (long)size_z);
                        iVar21 = iVar21 + 1;
                        lVar27 = lVar27 + lVar4;
                        lVar12 = lVar12 + lVar4;
                        lVar20 = lVar20 + lVar4;
                        pfVar22 = pfVar24;
                      } while (iVar21 != size_y);
                    }
                    lVar26 = lVar26 + (lVar11 - size_y) * lVar1 * 4;
                    pfVar25 = pfVar25 + (sVar7 - sVar8 * (long)size_y);
                    iVar10 = iVar10 + 1;
                  } while (iVar10 != size_x);
                }
              }
              else {
                compute_regression_coeffcients_3d<float>
                          (data_pos,size_x,size_y,size_z,size->dim0_offset,size->dim1_offset,
                           reg_params_pos);
                iVar10 = sz_blockwise_selection_3d<float>
                                   (data_pos,mean_info,size->dim0_offset,size->dim1_offset,iVar10,
                                    (float)(precision * 1.22),reg_params_pos);
                *local_168 = (uchar)iVar10;
                if ((uchar)iVar10 == '\0') goto LAB_00104d94;
                pfVar25 = *reg_unpredictable_data_pos;
                lVar26 = 0;
                do {
                  fVar32 = reg_params_pos[lVar26];
                  dVar34 = local_58[lVar26];
                  fVar33 = fVar32 - reg_params_pos[lVar26 + -4];
                  dVar36 = (double)ABS(fVar33) / dVar34 + 1.0;
                  if (65536.0 <= dVar36) {
LAB_00104b62:
                    reg_params_pos[lVar26] = fVar32;
                    *reg_unpredictable_data_pos = pfVar25 + 1;
                    *pfVar25 = fVar32;
                    iVar10 = 0;
                    pfVar25 = pfVar25 + 1;
                  }
                  else {
                    if (fVar33 <= 0.0) {
                      dVar36 = -dVar36;
                    }
                    fVar33 = (float)((double)((int)(dVar36 * 0.5) * 2) * dVar34 +
                                    (double)reg_params_pos[lVar26 + -4]);
                    reg_params_pos[lVar26] = fVar33;
                    if (dVar34 < (double)ABS(fVar33 - fVar32)) goto LAB_00104b62;
                    iVar10 = (int)(dVar36 * 0.5) + 0x8000;
                  }
                  reg_params_type[lVar26] = iVar10;
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 4);
                sVar7 = size->dim0_offset;
                sVar8 = size->dim1_offset;
                lVar26 = (long)pvVar23 + lVar1 * 4 + lVar29 * 4 + 4;
                iVar10 = 0;
                pfVar25 = *unpredictable_data_pos;
                pfVar22 = data_pos;
                do {
                  iVar21 = 0;
                  pfVar24 = pfVar25;
                  do {
                    pfVar31 = pfVar22;
                    piVar30 = type;
                    lVar27 = 0;
                    lVar20 = 0;
                    do {
                      fVar33 = (float)(int)lVar20 * reg_params_pos[2] +
                               *reg_params_pos * (float)iVar10 + reg_params_pos[1] * (float)iVar21 +
                               reg_params_pos[3];
                      fVar32 = pfVar31[lVar20];
                      fVar35 = fVar32 - fVar33;
                      dVar34 = (double)ABS(fVar35) / precision + 1.0;
                      if ((double)capacity <= dVar34) {
LAB_00104ce5:
                        *(float *)(lVar26 + lVar20 * 4) = fVar32;
                        pfVar24 = pfVar25 + 1;
                        *unpredictable_data_pos = pfVar24;
                        *pfVar25 = fVar32;
                        iVar28 = 0;
                        pfVar25 = pfVar24;
                      }
                      else {
                        if (fVar35 <= 0.0) {
                          dVar34 = -dVar34;
                        }
                        fVar33 = (float)((double)((int)(dVar34 * 0.5) * 2) * precision +
                                        (double)fVar33);
                        *(float *)(lVar26 + lVar20 * 4) = fVar33;
                        if (precision < (double)ABS(fVar33 - fVar32)) goto LAB_00104ce5;
                        iVar28 = (int)(dVar34 * 0.5) + intv_radius;
                      }
                      piVar30[lVar20] = iVar28;
                      lVar20 = lVar20 + 1;
                      lVar27 = lVar27 + -4;
                    } while (size_z != (int)lVar20);
                    lVar26 = lVar26 + lVar4;
                    iVar21 = iVar21 + 1;
                    type = (int *)((long)piVar30 - lVar27);
                    pfVar22 = (float *)((long)pfVar31 + ((sVar8 * 4 + (long)size_z * -4) - lVar27));
                  } while (iVar21 != size_y);
                  lVar26 = lVar26 + (lVar11 - size_y) * lVar1 * 4;
                  pfVar22 = (float *)((long)pfVar31 +
                                     ((((long)size_y * -4 + 4) * sVar8 + sVar7 * 4 +
                                      (long)size_z * -4) - lVar27));
                  iVar10 = iVar10 + 1;
                  type = (int *)((long)piVar30 - lVar27);
                  pfVar25 = pfVar24;
                } while (iVar10 != size_x);
                local_100 = local_100 + 1;
                reg_params_pos = reg_params_pos + 4;
                reg_params_type = reg_params_type + 4;
                type = (int *)((long)piVar30 - lVar27);
              }
              uVar16 = (ulong)(uint)size->block_size;
              lVar26 = (long)size->block_size;
              pvVar23 = (void *)((long)pvVar23 + lVar26 * 4);
              local_168 = local_168 + 1;
              data_pos = data_pos + size_z;
              uVar13 = size->num_z;
              uVar14 = uVar3;
            } while (uVar3 < uVar13);
            local_158 = size->num_y;
          }
          local_150 = local_150 + 1;
          pfVar19 = pfVar19 + size->dim1_offset * lVar26;
          pvVar23 = (void *)((long)pvVar23 + (lVar1 - uVar13) * lVar26 * 4);
        } while (local_150 < local_158);
        uVar13 = size->num_x;
        local_178 = local_158;
        local_160 = reg_params_type;
      }
      memcpy(__dest,(void *)((long)__dest + lVar29 * (int)uVar16 * 4),lVar29 * 4);
      data = data + (long)(int)uVar16 * size->dim0_offset;
      uVar17 = uVar2;
      reg_params_type = local_160;
    } while (uVar2 < uVar13);
  }
  free(__dest);
  free(__ptr);
  return local_100;
}

Assistant:

size_t
prediction_and_quantization_3d_with_border_prediction(const T * data, const DSize_3d& size, const meanInfo<T>& mean_info, double precision,
	int capacity, int intv_radius, unsigned char * indicator, int * type, 
	int * reg_params_type, float *& reg_unpredictable_data_pos, T *& unpredictable_data_pos){
	const float noise = precision * LorenzeNoise3d;
	int * type_pos = type;
	unsigned char * indicator_pos = indicator;
	float * reg_params = (float *) malloc(RegCoeffNum3d * (size.num_blocks+1) * sizeof(float));
	for(int i=0; i<RegCoeffNum3d; i++)
		reg_params[i] = 0;
	float * reg_params_pos = reg_params + RegCoeffNum3d;
	int * reg_params_type_pos = reg_params_type;
	double reg_precisions[RegCoeffNum3d];
	float rel_param_err = RegErrThreshold * precision / RegCoeffNum3d;
	for(int i=0; i<RegCoeffNum3d-1; i++) 
		reg_precisions[i] = rel_param_err / size.block_size;
	reg_precisions[RegCoeffNum3d - 1] = rel_param_err;
	// maintain a buffer of (block_size+1)*(r2+1)*(r3+1)
	size_t buffer_dim0_offset = (size.d2+1)*(size.d3+1);
	size_t buffer_dim1_offset = size.d3+1;
	T * pred_buffer = (T *) malloc((size.block_size+1)*(size.d2+1)*(size.d3+1)*sizeof(T));
	memset(pred_buffer, 0, (size.block_size+1)*(size.d2+1)*(size.d3+1)*sizeof(T));
	size_t reg_count = 0;
	int capacity_lorenzo = mean_info.use_mean ? capacity - 2 : capacity;
	const T * x_data_pos = data;
	for(size_t i=0; i<size.num_x; i++){
		const T * y_data_pos = x_data_pos;
		T * pred_buffer_pos = pred_buffer;
		for(size_t j=0; j<size.num_y; j++){
			const T * z_data_pos = y_data_pos;
			for(size_t k=0; k<size.num_z; k++){
				int size_x = ((i+1)*size.block_size < size.d1) ? size.block_size : size.d1 - i*size.block_size;
				int size_y = ((j+1)*size.block_size < size.d2) ? size.block_size : size.d2 - j*size.block_size;
				int size_z = ((k+1)*size.block_size < size.d3) ? size.block_size : size.d3 - k*size.block_size;
				int min_size = MIN(size_x, size_y);
				min_size = MIN(min_size, size_z);
				// size of block is less than some threshold
				if(min_size < RegThresholdSize3d){
					*indicator_pos = 0;
				}
				else{
					compute_regression_coeffcients_3d(z_data_pos, size_x, size_y, size_z, size.dim0_offset, size.dim1_offset, reg_params_pos);
					*indicator_pos = sz_blockwise_selection_3d(z_data_pos, mean_info, size.dim0_offset, size.dim1_offset, min_size, noise, reg_params_pos);
				}
				if(*indicator_pos){
					// regression
					compress_regression_coefficient_3d(reg_precisions, reg_params_pos, reg_params_type_pos, reg_unpredictable_data_pos);
					block_pred_and_quant_regression_3d_with_buffer(z_data_pos, reg_params_pos, pred_buffer_pos, precision, capacity, intv_radius, 
						size_x, size_y, size_z, buffer_dim0_offset, buffer_dim1_offset, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
					reg_count ++;
					reg_params_pos += RegCoeffNum3d;
					reg_params_type_pos += RegCoeffNum3d;
				}
				else{
					// Lorenzo
					block_pred_and_quant_lorenzo_3d(mean_info, z_data_pos, pred_buffer_pos, precision, capacity_lorenzo, intv_radius, 
						size_x, size_y, size_z, buffer_dim0_offset, buffer_dim1_offset, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
				}
				pred_buffer_pos += size.block_size;
				indicator_pos ++;
				z_data_pos += size_z;
			}
			y_data_pos += size.block_size*size.dim1_offset;
			pred_buffer_pos += size.block_size*buffer_dim1_offset - size.block_size*size.num_z;
		}
		// copy bottom of buffer to top of buffer
		memcpy(pred_buffer, pred_buffer + size.block_size*buffer_dim0_offset, buffer_dim0_offset*sizeof(T));
		x_data_pos += size.block_size*size.dim0_offset;
	}
	free(pred_buffer);
	free(reg_params);
	return reg_count;
}